

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O2

void __thiscall
gmlc::libguarded::
atomic_guarded<std::function<void(helics::Input&,TimeRepresentation<count_time<9,long>>)>,std::mutex>
::store<std::function<void(helics::Input&,TimeRepresentation<count_time<9,long>>)>>
          (atomic_guarded<std::function<void(helics::Input&,TimeRepresentation<count_time<9,long>>)>,std::mutex>
           *this,function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *newObj)

{
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x20))->__data);
  std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::operator=
            ((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)this,
             newObj);
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x20));
  return;
}

Assistant:

void store(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
    }